

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O0

ImPlotTick * __thiscall ImPlotTickCollection::Append(ImPlotTickCollection *this,ImPlotTick *tick)

{
  float fVar1;
  ImPlotTick *pIVar2;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  ImPlotTick *tick_local;
  ImPlotTickCollection *this_local;
  
  if ((tick->ShowLabel & 1U) != 0) {
    if ((tick->ShowLabel & 1U) == 0) {
      local_24 = 0.0;
    }
    else {
      local_24 = (tick->LabelSize).x;
    }
    this->TotalWidth = local_24 + this->TotalWidth;
    if ((tick->ShowLabel & 1U) == 0) {
      local_28 = 0.0;
    }
    else {
      local_28 = (tick->LabelSize).y;
    }
    this->TotalHeight = local_28 + this->TotalHeight;
    fVar1 = (tick->LabelSize).x;
    if (fVar1 < this->MaxWidth || fVar1 == this->MaxWidth) {
      local_2c = this->MaxWidth;
    }
    else {
      local_2c = (tick->LabelSize).x;
    }
    this->MaxWidth = local_2c;
    fVar1 = (tick->LabelSize).y;
    if (fVar1 < this->MaxHeight || fVar1 == this->MaxHeight) {
      local_30 = this->MaxHeight;
    }
    else {
      local_30 = (tick->LabelSize).y;
    }
    this->MaxHeight = local_30;
  }
  ImVector<ImPlotTick>::push_back(&this->Ticks,tick);
  this->Size = this->Size + 1;
  pIVar2 = ImVector<ImPlotTick>::back(&this->Ticks);
  return pIVar2;
}

Assistant:

const ImPlotTick& Append(const ImPlotTick& tick) {
        if (tick.ShowLabel) {
            TotalWidth    += tick.ShowLabel ? tick.LabelSize.x : 0;
            TotalHeight   += tick.ShowLabel ? tick.LabelSize.y : 0;
            MaxWidth      =  tick.LabelSize.x > MaxWidth  ? tick.LabelSize.x : MaxWidth;
            MaxHeight     =  tick.LabelSize.y > MaxHeight ? tick.LabelSize.y : MaxHeight;
        }
        Ticks.push_back(tick);
        Size++;
        return Ticks.back();
    }